

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool DockNodeIsDropAllowedOne(ImGuiWindow_conflict *payload,ImGuiWindow_conflict *host_window)

{
  ImGuiID IVar1;
  ImGuiID IVar2;
  ImGuiDockNode *pIVar3;
  ImGuiWindowClass *pIVar4;
  
  pIVar3 = host_window->DockNodeAsHost;
  if (((pIVar3 == (ImGuiDockNode *)0x0) || ((pIVar3->MergedFlags & 0x400) == 0)) ||
     (host_window->BeginOrderWithinContext <= payload->BeginOrderWithinContext)) {
    pIVar4 = &host_window->WindowClass;
    if (pIVar3 != (ImGuiDockNode *)0x0) {
      pIVar4 = &pIVar3->WindowClass;
    }
    IVar1 = pIVar4->ClassId;
    IVar2 = (payload->WindowClass).ClassId;
    if (((IVar1 == IVar2) ||
        (((IVar1 != 0 && (IVar2 == 0)) && (pIVar4->DockingAllowUnclassed != false)))) ||
       (((IVar2 != 0 && (IVar1 == 0)) && ((payload->WindowClass).DockingAllowUnclassed != false))))
    {
      return true;
    }
  }
  return false;
}

Assistant:

static bool DockNodeIsDropAllowedOne(ImGuiWindow* payload, ImGuiWindow* host_window)
{
    if (host_window->DockNodeAsHost && host_window->DockNodeAsHost->IsDockSpace() && payload->BeginOrderWithinContext < host_window->BeginOrderWithinContext)
        return false;

    ImGuiWindowClass* host_class = host_window->DockNodeAsHost ? &host_window->DockNodeAsHost->WindowClass : &host_window->WindowClass;
    ImGuiWindowClass* payload_class = &payload->WindowClass;
    if (host_class->ClassId != payload_class->ClassId)
    {
        if (host_class->ClassId != 0 && host_class->DockingAllowUnclassed && payload_class->ClassId == 0)
            return true;
        if (payload_class->ClassId != 0 && payload_class->DockingAllowUnclassed && host_class->ClassId == 0)
            return true;
        return false;
    }

    return true;
}